

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O3

void __thiscall DIS::VariableDatum::unmarshal(VariableDatum *this,DataStream *dataStream)

{
  pointer pEVar1;
  pointer pEVar2;
  uint uVar3;
  pointer pEVar4;
  ulong uVar5;
  EightByteChunk x;
  EightByteChunk local_40;
  
  DataStream::operator>>(dataStream,&this->_variableDatumID);
  DataStream::operator>>(dataStream,&this->_variableDatumLength);
  uVar3 = ((this->_variableDatumLength >> 6) + 1) - (uint)((this->_variableDatumLength & 0x3f) == 0)
  ;
  this->_variableDatumLength = uVar3;
  pEVar1 = (this->_variableDatums).
           super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (this->_variableDatums).
           super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar4 = pEVar1;
  if (pEVar2 != pEVar1) {
    do {
      (**pEVar4->_vptr_EightByteChunk)(pEVar4);
      pEVar4 = pEVar4 + 1;
    } while (pEVar4 != pEVar2);
    (this->_variableDatums).
    super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
    super__Vector_impl_data._M_finish = pEVar1;
    uVar3 = this->_variableDatumLength;
  }
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      EightByteChunk::EightByteChunk(&local_40);
      EightByteChunk::unmarshal(&local_40,dataStream);
      std::vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>::push_back
                (&this->_variableDatums,&local_40);
      EightByteChunk::~EightByteChunk(&local_40);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->_variableDatumLength);
  }
  return;
}

Assistant:

void VariableDatum::unmarshal(DataStream& dataStream)
{
    dataStream >> _variableDatumID;
    dataStream >> _variableDatumLength;
    _variableDatumLength = (_variableDatumLength / 64) + ((_variableDatumLength % 64) > 0);

     _variableDatums.clear();
     for(size_t idx = 0; idx < _variableDatumLength; idx++)
     {
        EightByteChunk x;
        x.unmarshal(dataStream);
        _variableDatums.push_back(x);
     }
}